

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

void __thiscall
QSqlRelationalTableModel::setRelation
          (QSqlRelationalTableModel *this,int column,QSqlRelation *relation)

{
  long lVar1;
  QSqlRelationalTableModelPrivate *pQVar2;
  qsizetype qVar3;
  QRelation *this_00;
  int in_ESI;
  QSharedPointer<QRelation> *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype oldSize;
  QSqlRelationalTableModelPrivate *d;
  QSharedPointer<QRelation> *in_stack_ffffffffffffffa8;
  qsizetype in_stack_ffffffffffffffb8;
  QSharedPointer<QRelation> *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSqlRelationalTableModel *)0x159cc3);
  if (-1 < in_ESI) {
    qVar3 = QList<QSharedPointer<QRelation>_>::size(&pQVar2->relations);
    if (qVar3 <= in_ESI) {
      in_stack_ffffffffffffffa8 =
           (QSharedPointer<QRelation> *)QList<QSharedPointer<QRelation>_>::size(&pQVar2->relations);
      QList<QSharedPointer<QRelation>_>::resize
                ((QList<QSharedPointer<QRelation>_> *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffb8);
      while (this_01 = in_stack_ffffffffffffffa8,
            qVar3 = QList<QSharedPointer<QRelation>_>::size(&pQVar2->relations),
            (long)in_stack_ffffffffffffffa8 < qVar3) {
        QSharedPointer<QRelation>::create<>();
        QList<QSharedPointer<QRelation>_>::operator[]
                  ((QList<QSharedPointer<QRelation>_> *)in_RDI,(qsizetype)in_stack_ffffffffffffffa8)
        ;
        QSharedPointer<QRelation>::operator=(this_01,in_RDI);
        QSharedPointer<QRelation>::~QSharedPointer((QSharedPointer<QRelation> *)0x159d8b);
        in_stack_ffffffffffffffa8 = (QSharedPointer<QRelation> *)((long)&(this_01->value).ptr + 1);
      }
    }
    QList<QSharedPointer<QRelation>_>::at
              ((QList<QSharedPointer<QRelation>_> *)in_RDI,(qsizetype)in_stack_ffffffffffffffa8);
    this_00 = QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x159dbb);
    QRelation::init(this_00,(EVP_PKEY_CTX *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSqlRelationalTableModel::setRelation(int column, const QSqlRelation &relation)
{
    Q_D(QSqlRelationalTableModel);
    if (column < 0)
        return;
    if (d->relations.size() <= column) {
        const auto oldSize = d->relations.size();
        d->relations.resize(column + 1);
        for (auto i = oldSize; i < d->relations.size(); ++i)
            d->relations[i] = QSharedPointer<QRelation>::create();
    }
    d->relations.at(column)->init(this, relation, column);
}